

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  long in_RDI;
  DFA *unaff_retaddr;
  int i;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_2c;
  
  RWLocker::LockForWriting
            ((RWLocker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    *(undefined8 *)(in_RDI + 0xe8 + (long)local_2c * 0x10) = 0;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    *(undefined4 *)(in_RDI + 0xf0 + (long)local_2c * 0x10) = 0xffffffff;
  }
  ClearCache(unaff_retaddr);
  *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(in_RDI + 0xa8);
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  cache_lock->LockForWriting();

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++) {
    start_[i].start = NULL;
    start_[i].first_byte.store(kFbUnknown, std::memory_order_relaxed);
  }
  ClearCache();
  mem_budget_ = state_budget_;
}